

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O3

void __thiscall duckdb::StorageManager::~StorageManager(StorageManager *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

StorageManager::~StorageManager() {
}